

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

void __thiscall cppcms::http::details::basic_device::~basic_device(basic_device *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

basic_device() : 
			raw_mode_(false),
			final_(false),
			eof_send_(false),
			buffer_size_(0)
		{
		}